

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_mtree.c
# Opt level: O0

void remove_option(mtree_option **global,char *value,size_t len)

{
  int iVar1;
  size_t in_RDX;
  char *in_RSI;
  undefined8 *in_RDI;
  mtree_option *last;
  mtree_option *iter;
  undefined8 *local_28;
  undefined8 *local_20;
  
  local_28 = (undefined8 *)0x0;
  local_20 = (undefined8 *)*in_RDI;
  while ((local_20 != (undefined8 *)0x0 &&
         ((iVar1 = strncmp((char *)local_20[1],in_RSI,in_RDX), iVar1 != 0 ||
          ((*(char *)(local_20[1] + in_RDX) != '\0' && (*(char *)(local_20[1] + in_RDX) != '='))))))
        ) {
    local_28 = local_20;
    local_20 = (undefined8 *)*local_20;
  }
  if (local_20 != (undefined8 *)0x0) {
    if (local_28 == (undefined8 *)0x0) {
      *in_RDI = *local_20;
    }
    else {
      *local_28 = *local_20;
    }
    free((void *)local_20[1]);
    free(local_20);
  }
  return;
}

Assistant:

static void
remove_option(struct mtree_option **global, const char *value, size_t len)
{
	struct mtree_option *iter, *last;

	last = NULL;
	for (iter = *global; iter != NULL; last = iter, iter = iter->next) {
		if (strncmp(iter->value, value, len) == 0 &&
		    (iter->value[len] == '\0' ||
		     iter->value[len] == '='))
			break;
	}
	if (iter == NULL)
		return;
	if (last == NULL)
		*global = iter->next;
	else
		last->next = iter->next;

	free(iter->value);
	free(iter);
}